

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestBuildHandler::FragmentCompare::operator()(FragmentCompare *this,string *l,string *r)

{
  bool bVar1;
  int result;
  int local_1c;
  
  bVar1 = cmFileTimeCache::Compare(this->FTC,l,r,&local_1c);
  if (!bVar1 || local_1c == 0) {
    local_1c = std::__cxx11::string::compare((string *)l);
  }
  return SUB41((uint)local_1c >> 0x1f,0);
}

Assistant:

bool operator()(std::string const& l, std::string const& r) const
  {
    // Order files by modification time.  Use lexicographic order
    // among files with the same time.
    int result;
    if (this->FTC->Compare(l, r, &result) && result != 0) {
      return result < 0;
    }
    return l < r;
  }